

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O2

bool __thiscall SQClass::GetConstructor(SQClass *this,SQObjectPtr *ctor)

{
  long lVar1;
  
  lVar1 = this->_constructoridx;
  if (lVar1 != -1) {
    SQObjectPtr::operator=(ctor,&(this->_methods)._vals[lVar1].val);
  }
  return lVar1 != -1;
}

Assistant:

bool GetConstructor(SQObjectPtr &ctor)
    {
        if(_constructoridx != -1) {
            ctor = _methods[_constructoridx].val;
            return true;
        }
        return false;
    }